

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O0

App * __thiscall CLI::App::add_subcommand(App *this,App_p *subcom)

{
  bool bVar1;
  IncorrectConstruction *this_00;
  ulong uVar2;
  element_type *peVar3;
  OptionAlreadyAdded *this_01;
  __shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2> *this_02;
  element_type *peVar4;
  App *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string *local_60;
  string *mstrg;
  App *ckapp;
  allocator local_39;
  string local_38;
  App_p *local_18;
  App_p *subcom_local;
  App *this_local;
  
  local_18 = subcom;
  subcom_local = (App_p *)this;
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)subcom);
  if (!bVar1) {
    ckapp._3_1_ = 1;
    this_00 = (IncorrectConstruction *)__cxa_allocate_exception(0x38);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_38,"passed App is not valid",&local_39);
    IncorrectConstruction::IncorrectConstruction(this_00,&local_38);
    ckapp._3_1_ = 0;
    __cxa_throw(this_00,&IncorrectConstruction::typeinfo,
                IncorrectConstruction::~IncorrectConstruction);
  }
  uVar2 = ::std::__cxx11::string::empty();
  local_b8 = this;
  if (((uVar2 & 1) != 0) && (this->parent_ != (App *)0x0)) {
    local_b8 = _get_fallthrough_parent(this);
  }
  mstrg = (string *)local_b8;
  peVar3 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     ((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      subcom);
  local_60 = _compare_subcommand_names_abi_cxx11_(this,peVar3,(App *)mstrg);
  uVar2 = ::std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    peVar3 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        subcom);
    peVar3->parent_ = this;
    std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::push_back
              (&this->subcommands_,subcom);
    this_02 = &std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::
               back(&this->subcommands_)->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>;
    peVar4 = std::__shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>::get(this_02);
    return peVar4;
  }
  this_01 = (OptionAlreadyAdded *)__cxa_allocate_exception(0x38);
  ::std::operator+(&local_80,"subcommand name or alias matches existing subcommand: ",local_60);
  OptionAlreadyAdded::OptionAlreadyAdded(this_01,&local_80);
  __cxa_throw(this_01,&OptionAlreadyAdded::typeinfo,OptionAlreadyAdded::~OptionAlreadyAdded);
}

Assistant:

CLI11_INLINE App *App::add_subcommand(CLI::App_p subcom) {
    if(!subcom)
        throw IncorrectConstruction("passed App is not valid");
    auto *ckapp = (name_.empty() && parent_ != nullptr) ? _get_fallthrough_parent() : this;
    const auto &mstrg = _compare_subcommand_names(*subcom, *ckapp);
    if(!mstrg.empty()) {
        throw(OptionAlreadyAdded("subcommand name or alias matches existing subcommand: " + mstrg));
    }
    subcom->parent_ = this;
    subcommands_.push_back(std::move(subcom));
    return subcommands_.back().get();
}